

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
read_compressed_run(uint8_t *start,uint8_t *end)

{
  byte *in_RDX;
  byte *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  uint32_t next;
  uint8_t *ptr;
  int64_t prev;
  uint32_t shift;
  uint64_t acc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *res;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  byte *local_40;
  
  this = in_RDI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1b7ba9);
  for (local_40 = in_RSI; local_40 < in_RDX; local_40 = local_40 + 1) {
    if ((*local_40 & 0x80) == 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (this,(value_type_conflict3 *)in_RDI);
    }
  }
  return this;
}

Assistant:

std::vector<FileId> read_compressed_run(const uint8_t *start,
                                        const uint8_t *end) {
    std::vector<FileId> res;
    uint64_t acc = 0;
    uint32_t shift = 0;
    int64_t prev = -1;

    for (const uint8_t *ptr = start; ptr < end; ++ptr) {
        uint32_t next = *ptr;

        acc += (next & 0x7FU) << shift;
        shift += 7U;
        if ((next & 0x80U) == 0) {
            prev += acc + 1;
            res.push_back(prev);
            acc = 0;
            shift = 0;
        }
    }

    return res;
}